

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImStrTrimBlanks(char *buf)

{
  char cVar1;
  long lVar2;
  long lVar3;
  char *__src;
  size_t __n;
  
  lVar2 = 0;
  __src = buf;
  while( true ) {
    cVar1 = *__src;
    if ((cVar1 != '\t') && (cVar1 != ' ')) break;
    __src = __src + 1;
    lVar2 = lVar2 + -1;
  }
  __n = 0;
  while (cVar1 != '\0') {
    lVar3 = __n + 1;
    __n = __n + 1;
    cVar1 = __src[lVar3];
  }
  for (lVar3 = __n - lVar2;
      (__src < buf + lVar3 && ((buf[lVar3 + -1] == ' ' || (buf[lVar3 + -1] == '\t'))));
      lVar3 = lVar3 + -1) {
    __n = __n - 1;
  }
  if (lVar2 != 0) {
    memmove(buf,__src,__n);
  }
  buf[__n] = '\0';
  return;
}

Assistant:

void ImStrTrimBlanks(char* buf)
{
    char* p = buf;
    while (p[0] == ' ' || p[0] == '\t')     // Leading blanks
        p++;
    char* p_start = p;
    while (*p != 0)                         // Find end of string
        p++;
    while (p > p_start && (p[-1] == ' ' || p[-1] == '\t'))  // Trailing blanks
        p--;
    if (p_start != buf)                     // Copy memory if we had leading blanks
        memmove(buf, p_start, p - p_start);
    buf[p - p_start] = 0;                   // Zero terminate
}